

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cLayoutBindingTests.cpp
# Opt level: O2

LayoutBindingTestResult * __thiscall
glcts::AtomicCounterLayoutBindingCase::binding_array_size
          (LayoutBindingTestResult *__return_storage_ptr__,AtomicCounterLayoutBindingCase *this)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  LayoutBindingProgram *this_00;
  mapped_type_conflict *pmVar5;
  uint *puVar6;
  allocator<char> local_4cb;
  allocator<char> local_4ca;
  allocator<char> local_4c9;
  LayoutBindingTestResult *local_4c8;
  string *local_4c0;
  StringVector list;
  String local_480;
  StringIntMap bindingPoints;
  vector<int,_std::allocator<int>_> arraySizes;
  String local_418;
  string local_3f8 [32];
  String local_3d8;
  String local_3b8;
  string local_398 [32];
  String decl;
  ostringstream texUnitStr;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1e0;
  String local_1c8;
  StringStream s;
  undefined4 extraout_var_01;
  
  iVar3 = (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
            _vptr_TestNode[0x21])(this);
  LayoutBindingBaseCase::makeSparseRange(&arraySizes,&this->super_LayoutBindingBaseCase,iVar3,1);
  local_4c0 = (string *)&__return_storage_ptr__->m_reason;
  puVar6 = (uint *)arraySizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
  local_4c8 = __return_storage_ptr__;
  do {
    if (arraySizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish <= puVar6) {
      s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
           (_func_int **)
           &s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
      s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = 0;
      s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>._16_1_ = 0;
      LayoutBindingTestResult::LayoutBindingTestResult(local_4c8,true,(String *)&s,false);
      std::__cxx11::string::~string((string *)&s);
      break;
    }
    uVar1 = *puVar6;
    StringStream::StringStream(&s);
    poVar4 = std::operator<<((ostream *)&s,"[");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,uVar1);
    std::operator<<(poVar4,"]");
    iVar3 = (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
              _vptr_TestNode[0x13])(this);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&texUnitStr,*(char **)CONCAT44(extraout_var,iVar3),&local_4c9);
    (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
      _vptr_TestNode[0x1a])(&bindingPoints,this,0);
    iVar3 = (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
              _vptr_TestNode[0x13])(this);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_418,*(char **)(CONCAT44(extraout_var_00,iVar3) + 0x18),&local_4ca);
    (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
      _vptr_TestNode[0x17])(&list,this,0);
    (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
      _vptr_TestNode[0x1c])(&local_480,this,&list);
    (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
      _vptr_TestNode[0x17])(local_3f8,this,0);
    std::__cxx11::string::string<std::allocator<char>>(local_398,"float",&local_4cb);
    (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
      _vptr_TestNode[0x1d])(&local_3d8,this,local_3f8,local_398);
    (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
      _vptr_TestNode[0x17])(&local_3b8,this,0);
    (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
      _vptr_TestNode[0x1e])(&local_1c8,this,(ulong)uVar1);
    LayoutBindingBaseCase::buildUniformDecl
              (&decl,&this->super_LayoutBindingBaseCase,(String *)&texUnitStr,
               (String *)&bindingPoints,&local_418,&local_480,&local_3d8,&local_3b8,&local_1c8);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::string::~string((string *)&local_3b8);
    std::__cxx11::string::~string((string *)&local_3d8);
    std::__cxx11::string::~string(local_398);
    std::__cxx11::string::~string(local_3f8);
    std::__cxx11::string::~string((string *)&local_480);
    std::__cxx11::string::~string((string *)&list);
    std::__cxx11::string::~string((string *)&local_418);
    std::__cxx11::string::~string((string *)&bindingPoints);
    std::__cxx11::string::~string((string *)&texUnitStr);
    LayoutBindingBaseCase::setTemplateParam(&this->super_LayoutBindingBaseCase,"UNIFORM_DECL",&decl)
    ;
    StringStream::reset(&s);
    std::operator<<((ostream *)&s,"float accumulate(void)\n");
    std::operator<<((ostream *)&s,"{\n");
    std::operator<<((ostream *)&s,"  float acc = 0.0;\n");
    poVar4 = std::operator<<((ostream *)&s,"  for(int i=0; i < ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,uVar1);
    std::operator<<(poVar4," ; i++)\n");
    poVar4 = std::operator<<((ostream *)&s,"    acc = float(atomicCounter(");
    (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
      _vptr_TestNode[0x17])(&texUnitStr,this,0);
    poVar4 = std::operator<<(poVar4,(string *)&texUnitStr);
    std::operator<<(poVar4,"[i]));\n");
    std::__cxx11::string::~string((string *)&texUnitStr);
    std::operator<<((ostream *)&s,"  return acc;\n");
    std::operator<<((ostream *)&s,"}\n");
    std::__cxx11::stringbuf::str();
    LayoutBindingBaseCase::setTemplateParam
              (&this->super_LayoutBindingBaseCase,"OPTIONAL_FUNCTION_BLOCK",(String *)&texUnitStr);
    std::__cxx11::string::~string((string *)&texUnitStr);
    StringStream::reset(&s);
    std::operator<<((ostream *)&s,"vec4(accumulate(), 1.0, 0.0, 1.0);\n");
    std::__cxx11::stringbuf::str();
    LayoutBindingBaseCase::setTemplateParam
              (&this->super_LayoutBindingBaseCase,"UNIFORM_ACCESS",(String *)&texUnitStr);
    std::__cxx11::string::~string((string *)&texUnitStr);
    LayoutBindingBaseCase::updateTemplate(&this->super_LayoutBindingBaseCase);
    texUnitStr.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
         (_func_int **)&texUnitStr.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
    texUnitStr.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = 0;
    texUnitStr.super_basic_ostream<char,_std::char_traits<char>_>._16_1_ = 0;
    LayoutBindingBaseCase::setTemplateParam
              (&this->super_LayoutBindingBaseCase,"OPTIONAL_FUNCTION_BLOCK",(String *)&texUnitStr);
    std::__cxx11::string::~string((string *)&texUnitStr);
    iVar3 = (*(this->super_LayoutBindingBaseCase).super_IProgramContextSupplier.
              _vptr_IProgramContextSupplier[6])();
    this_00 = (LayoutBindingProgram *)CONCAT44(extraout_var_01,iVar3);
    bVar2 = LayoutBindingProgram::compiledAndLinked(this_00);
    if (bVar2) {
      list.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      list.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      list.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&texUnitStr);
      (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
        _vptr_TestNode[0x17])
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&bindingPoints
                 ,this,0);
      poVar4 = std::operator<<(&texUnitStr.super_basic_ostream<char,_std::char_traits<char>_>,
                               (string *)&bindingPoints);
      std::operator<<(poVar4,"[0]");
      std::__cxx11::string::~string((string *)&bindingPoints);
      std::__cxx11::stringbuf::str();
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&list,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&bindingPoints
                );
      std::__cxx11::string::~string((string *)&bindingPoints);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_1e0,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&list);
      (*this_00->_vptr_LayoutBindingProgram[3])
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&bindingPoints
                 ,this_00,&local_1e0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_1e0);
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                             *)&bindingPoints,
                            list.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
      bVar2 = *pmVar5 == 0;
      if (!bVar2) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_480,"binding point did not match default",
                   (allocator<char> *)&local_3d8);
        pmVar5 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                 ::operator[](&bindingPoints,
                              list.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
        LayoutBindingBaseCase::generateLog<int,int>
                  (&local_418,&this->super_LayoutBindingBaseCase,&local_480,*pmVar5,1);
        local_4c8->m_passed = false;
        local_4c8->m_notRunForThisContext = false;
        std::__cxx11::string::string(local_4c0,(string *)&local_418);
        std::__cxx11::string::~string((string *)&local_418);
        std::__cxx11::string::~string((string *)&local_480);
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
      ::~_Rb_tree(&bindingPoints._M_t);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&texUnitStr);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&list);
    }
    else {
      LayoutBindingProgram::getErrorLog_abi_cxx11_((String *)&texUnitStr,this_00,false);
      local_4c8->m_passed = false;
      local_4c8->m_notRunForThisContext = false;
      std::__cxx11::string::string(local_4c0,(string *)&texUnitStr);
      std::__cxx11::string::~string((string *)&texUnitStr);
      bVar2 = false;
    }
    (*this_00->_vptr_LayoutBindingProgram[1])(this_00);
    std::__cxx11::string::~string((string *)&decl);
    StringStream::~StringStream(&s);
    puVar6 = puVar6 + 1;
  } while (bVar2);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&arraySizes.super__Vector_base<int,_std::allocator<int>_>);
  return local_4c8;
}

Assistant:

LayoutBindingTestResult binding_array_size(void)
	{
		bool passed = true;

		//== test different sized arrays
		std::vector<int> arraySizes = makeSparseRange(maxArraySize(), 1);
		for (std::vector<int>::iterator it = arraySizes.begin(); it < arraySizes.end(); it++)
		{
			int			 arraySize = *it;
			StringStream s;
			s << "[" << arraySize << "]";
			String decl =
				buildUniformDecl(String(getTestParameters().keyword), buildLayout(0),
								 String(getTestParameters().uniform_type), buildBlockName(getDefaultUniformName()),
								 buildBlock(getDefaultUniformName()), getDefaultUniformName(), buildArray(arraySize));
			setTemplateParam("UNIFORM_DECL", decl);

			s.reset();
			// build a function that accesses the whole array
			s << "float accumulate(void)\n";
			s << "{\n";
			s << "  float acc = 0.0;\n";
			s << "  for(int i=0; i < " << arraySize << " ; i++)\n";
			s << "    acc = float(atomicCounter(" << getDefaultUniformName() << "[i]));\n";
			s << "  return acc;\n";
			s << "}\n";

			setTemplateParam("OPTIONAL_FUNCTION_BLOCK", s.str());

			s.reset();
			s << "vec4(accumulate(), 1.0, 0.0, 1.0);\n";
			setTemplateParam("UNIFORM_ACCESS", s.str());
			updateTemplate();

			setTemplateParam("OPTIONAL_FUNCTION_BLOCK", String());

			LayoutBindingProgram::LayoutBindingProgramAutoPtr program(*this);
			passed &= program->compiledAndLinked();
			if (!passed)
			{
				return LayoutBindingTestResult(passed, program->getErrorLog());
			}

			StringVector	   list;
			std::ostringstream texUnitStr;
			texUnitStr << getDefaultUniformName() << "[0]";
			list.push_back(texUnitStr.str());

			StringIntMap bindingPoints = program->getBindingPoints(list);
			passed &= (0 == bindingPoints[list[0]]);
			if (!passed)
			{
				return LayoutBindingTestResult(
					passed, generateLog(String("binding point did not match default"), bindingPoints[list[0]], 1));
			}
		}

		return LayoutBindingTestResult(passed, String());
	}